

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

int Abc_NtkDarBmcInter_int(Aig_Man_t *pMan,Inter_ManParams_t *pPars,Aig_Man_t **ppNtkRes)

{
  Aig_Man_t **ppAVar1;
  uint uVar2;
  abctime aVar3;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAVar4;
  Aig_Man_t *pAVar5;
  Abc_Cex_t *pAVar6;
  abctime aVar7;
  ulong uVar8;
  char *format;
  int iVar9;
  Vec_Ptr_t *p;
  uint i;
  uint local_4c;
  uint local_48;
  int iFrame;
  Aig_Man_t **local_40;
  abctime local_38;
  
  aVar3 = Abc_Clock();
  if (pMan->nRegs < 1) {
    __assert_fail("pMan->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x996,
                  "int Abc_NtkDarBmcInter_int(Aig_Man_t *, Inter_ManParams_t *, Aig_Man_t **)");
  }
  if (ppNtkRes != (Aig_Man_t **)0x0) {
    *ppNtkRes = (Aig_Man_t *)0x0;
  }
  if (pPars->fUseSeparate == 0) {
    pAVar4 = pMan;
    uVar2 = Inter_ManPerformInterpolation(pMan,pPars,&iFrame);
    iVar9 = (int)pAVar4;
  }
  else {
    uVar2 = 0xffffffff;
    local_4c = 0;
    local_48 = 0;
    local_40 = ppNtkRes;
    local_38 = aVar3;
    for (i = 0; (int)i < pMan->nTruePos; i = i + 1) {
      p = pMan->vCos;
      pObj = (Aig_Obj_t *)Vec_PtrEntry(p,i);
      if (pMan->pConst1 != (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe)) {
        if (pPars->fVerbose != 0) {
          Abc_Print((int)p,"Solving output %2d (out of %2d):\n",(ulong)i);
        }
        pAVar4 = Aig_ManDupOneOutput(pMan,i,1);
        pAVar5 = Aig_ManScl(pAVar4,1,1,0,-1,-1,0,0);
        Aig_ManStop(pAVar4);
        if (pAVar5->nRegs == 0) {
          pAVar5->pSeqModel = (Abc_Cex_t *)0x0;
          pAVar4 = pAVar5;
          uVar2 = Fra_FraigSat(pAVar5,(long)pPars->nBTLimit,0,0,0,0,0,0,0,0);
          iVar9 = (int)pAVar4;
          if ((int *)pAVar5->pData != (int *)0x0) {
            iVar9 = pMan->nRegs;
            pAVar6 = Abc_CexCreate(iVar9,pMan->nTruePis,(int *)pAVar5->pData,0,i,1);
            pAVar5->pSeqModel = pAVar6;
          }
        }
        else {
          pAVar4 = pAVar5;
          uVar2 = Inter_ManPerformInterpolation(pAVar5,pPars,&iFrame);
          iVar9 = (int)pAVar4;
        }
        pAVar6 = pAVar5->pSeqModel;
        if (pAVar6 == (Abc_Cex_t *)0x0) {
          if (uVar2 == 1) {
            Aig_ObjPatchFanin0(pMan,pObj,(Aig_Obj_t *)((ulong)pMan->pConst1 ^ 1));
          }
          else {
            local_48 = local_48 + 1;
          }
          Aig_ManStop(pAVar5);
          Abc_Print((int)pAVar5,"Solving output %3d (out of %3d) using interpolation.\r",(ulong)i);
        }
        else {
          if (pPars->fDropSatOuts == 0) {
            pMan->pSeqModel = pAVar6;
            pAVar5->pSeqModel = (Abc_Cex_t *)0x0;
            pAVar6->iPo = i;
            Aig_ManStop(pAVar5);
            break;
          }
          Abc_Print(iVar9,
                    "Output %d proved SAT in frame %d (replacing by const 0 and continuing...)\n",
                    (ulong)i);
          Aig_ObjPatchFanin0(pMan,pObj,(Aig_Obj_t *)((ulong)pMan->pConst1 ^ 1));
          Aig_ManStop(pAVar5);
          local_4c = local_4c + 1;
        }
      }
    }
    pAVar4 = pMan;
    Aig_ManCleanup(pMan);
    aVar3 = local_38;
    iVar9 = (int)pAVar4;
    if (pMan->pSeqModel == (Abc_Cex_t *)0x0) {
      Abc_Print(iVar9,"Interpolation left %d (out of %d) outputs unsolved              \n",
                (ulong)local_48);
      uVar2 = uVar2 | -(uint)(local_48 != 0);
    }
    ppAVar1 = local_40;
    if (local_40 != (Aig_Man_t **)0x0) {
      pAVar4 = Aig_ManDupUnsolvedOutputs(pMan,1);
      pAVar5 = Aig_ManScl(pAVar4,1,1,0,-1,-1,0,0);
      *ppAVar1 = pAVar5;
      Aig_ManStop(pAVar4);
      iVar9 = (int)pAVar4;
    }
    if (local_4c != 0) {
      Abc_Print(iVar9,"The total of %d outputs proved SAT and replaced by const 0 in this run.\n",
                (ulong)local_4c);
    }
  }
  if (uVar2 == 0xffffffff) {
    format = "Property UNDECIDED.  ";
  }
  else {
    if (uVar2 == 0) {
      if (pMan->pSeqModel == (Abc_Cex_t *)0x0) {
        uVar8 = 0xffffffffffffffff;
      }
      else {
        uVar8 = (ulong)(uint)pMan->pSeqModel->iPo;
      }
      Abc_Print(iVar9,"Output %d of miter \"%s\" was asserted in frame %d.  ",uVar8,pMan->pName,
                (ulong)(uint)iFrame);
      goto LAB_00230f44;
    }
    if (uVar2 != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                    ,0x9ee,
                    "int Abc_NtkDarBmcInter_int(Aig_Man_t *, Inter_ManParams_t *, Aig_Man_t **)");
    }
    format = "Property proved.  ";
  }
  Abc_Print(iVar9,format);
LAB_00230f44:
  Abc_Print(iVar9,"%s =","Time");
  aVar7 = Abc_Clock();
  Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar7 - aVar3) / 1000000.0);
  return uVar2;
}

Assistant:

int Abc_NtkDarBmcInter_int( Aig_Man_t * pMan, Inter_ManParams_t * pPars, Aig_Man_t ** ppNtkRes )
{
    int RetValue = -1, iFrame;
    abctime clk = Abc_Clock();
    int nTotalProvedSat = 0;
    assert( pMan->nRegs > 0 );
    if ( ppNtkRes )
        *ppNtkRes = NULL;
    if ( pPars->fUseSeparate )
    {
        Aig_Man_t * pTemp, * pAux;
        Aig_Obj_t * pObjPo;
        int i, Counter = 0;
        Saig_ManForEachPo( pMan, pObjPo, i )
        {
            if ( Aig_ObjFanin0(pObjPo) == Aig_ManConst1(pMan) )
                continue;
            if ( pPars->fVerbose )
                Abc_Print( 1, "Solving output %2d (out of %2d):\n", i, Saig_ManPoNum(pMan) );
            pTemp = Aig_ManDupOneOutput( pMan, i, 1 );
            pTemp = Aig_ManScl( pAux = pTemp, 1, 1, 0, -1, -1, 0, 0 );
            Aig_ManStop( pAux );
            if ( Aig_ManRegNum(pTemp) == 0 )
            {
                pTemp->pSeqModel = NULL;
                RetValue = Fra_FraigSat( pTemp, pPars->nBTLimit, 0, 0, 0, 0, 0, 0, 0, 0 ); 
                if ( pTemp->pData )
                    pTemp->pSeqModel = Abc_CexCreate( Aig_ManRegNum(pMan), Saig_ManPiNum(pMan), (int *)pTemp->pData, 0, i, 1 );
//                pNtk->pModel = pTemp->pData, pTemp->pData = NULL;
            }
            else
                RetValue = Inter_ManPerformInterpolation( pTemp, pPars, &iFrame );
            if ( pTemp->pSeqModel )
            {
                if ( pPars->fDropSatOuts )
                {
                    Abc_Print( 1, "Output %d proved SAT in frame %d (replacing by const 0 and continuing...)\n", i, pTemp->pSeqModel->iFrame );
                    Aig_ObjPatchFanin0( pMan, pObjPo, Aig_ManConst0(pMan) );
                    Aig_ManStop( pTemp );
                    nTotalProvedSat++;
                    continue;
                }
                else
                {
                    Abc_Cex_t * pCex;
                    pCex = pMan->pSeqModel = pTemp->pSeqModel; pTemp->pSeqModel = NULL;
                    pCex->iPo = i;
                    Aig_ManStop( pTemp );
                    break;
                }
            }
            // if solved, remove the output
            if ( RetValue == 1 )
            {
                Aig_ObjPatchFanin0( pMan, pObjPo, Aig_ManConst0(pMan) );
//                    Abc_Print( 1, "Output %3d : Solved ", i );
            }
            else
            {
                Counter++;
//                    Abc_Print( 1, "Output %3d : Undec  ", i );
            }
//                Aig_ManPrintStats( pTemp );
            Aig_ManStop( pTemp );
            Abc_Print( 1, "Solving output %3d (out of %3d) using interpolation.\r", i, Saig_ManPoNum(pMan) );
        }
        Aig_ManCleanup( pMan );
        if ( pMan->pSeqModel == NULL )
        {
            Abc_Print( 1, "Interpolation left %d (out of %d) outputs unsolved              \n", Counter, Saig_ManPoNum(pMan) );
            if ( Counter )
                RetValue = -1;
        }
        if ( ppNtkRes )
        {
            pTemp = Aig_ManDupUnsolvedOutputs( pMan, 1 );
            *ppNtkRes = Aig_ManScl( pTemp, 1, 1, 0, -1, -1, 0, 0 );
            Aig_ManStop( pTemp );
        }
    }
    else
    {    
        RetValue = Inter_ManPerformInterpolation( pMan, pPars, &iFrame );
    }
    if ( nTotalProvedSat )
        Abc_Print( 1, "The total of %d outputs proved SAT and replaced by const 0 in this run.\n", nTotalProvedSat );
    if ( RetValue == 1 )
        Abc_Print( 1, "Property proved.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pMan->pSeqModel ? pMan->pSeqModel->iPo : -1, pMan->pName, iFrame );
    else if ( RetValue == -1 )
        Abc_Print( 1, "Property UNDECIDED.  " );
    else
        assert( 0 );
ABC_PRT( "Time", Abc_Clock() - clk );
    return RetValue;
}